

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall Imf_3_4::Header::insert(Header *this,char *name,Attribute *attribute)

{
  float fVar1;
  int iVar2;
  iterator iVar3;
  undefined4 extraout_var;
  long lVar4;
  CompressionRecord *pCVar5;
  char *pcVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *ppAVar7;
  ArgExc *this_00;
  undefined4 extraout_var_03;
  ostream *poVar8;
  size_t sVar9;
  TypeExc *this_01;
  stringstream _iex_throw_s;
  key_type local_1a8;
  
  if (*name == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8._text + 0x10),"Image attribute name cannot be an empty string."
               ,0x2f);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&local_1a8);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  strncpy(local_1a8._text,name,0xff);
  local_1a8._text[0xff] = '\0';
  iVar3 = std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
          ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                  *)this,&local_1a8);
  iVar2 = strcmp(name,"dwaCompressionLevel");
  if (iVar2 == 0) {
    iVar2 = (*attribute->_vptr_Attribute[2])(attribute);
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"float");
    if (iVar2 == 0) {
      lVar4 = __dynamic_cast(attribute,&Attribute::typeinfo,&TypedAttribute<float>::typeinfo,0);
      if (lVar4 == 0) {
        __cxa_bad_cast();
      }
      fVar1 = *(float *)(lVar4 + 8);
      pCVar5 = anon_unknown_1::retrieveCompressionRecord(this);
      pCVar5->dwa_level = fVar1;
    }
  }
  if ((_Rb_tree_header *)iVar3._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    iVar2 = (*attribute->_vptr_Attribute[3])(attribute);
    strncpy(local_1a8._text,name,0xff);
    local_1a8._text[0xff] = '\0';
    ppAVar7 = std::
              map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
              ::operator[](&this->_map,&local_1a8);
    *ppAVar7 = (mapped_type)CONCAT44(extraout_var_02,iVar2);
  }
  else {
    pcVar6 = (char *)(**(code **)(**(long **)(iVar3._M_node + 9) + 0x10))();
    iVar2 = (*attribute->_vptr_Attribute[2])(attribute);
    iVar2 = strcmp(pcVar6,(char *)CONCAT44(extraout_var_00,iVar2));
    if (iVar2 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8._text + 0x10),"Cannot assign a value of type \"",0x1f);
      iVar2 = (*attribute->_vptr_Attribute[2])(attribute);
      poVar8 = std::operator<<((ostream *)(local_1a8._text + 0x10),
                               (char *)CONCAT44(extraout_var_03,iVar2));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to image attribute \"",0x16);
      sVar9 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,name,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type \"",0xb);
      pcVar6 = (char *)(**(code **)(**(long **)(iVar3._M_node + 9) + 0x10))();
      poVar8 = std::operator<<(poVar8,pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
      this_01 = (TypeExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::TypeExc::TypeExc(this_01,(stringstream *)&local_1a8);
      __cxa_throw(this_01,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
    }
    iVar2 = (*attribute->_vptr_Attribute[3])(attribute);
    if (*(long **)(iVar3._M_node + 9) != (long *)0x0) {
      (**(code **)(**(long **)(iVar3._M_node + 9) + 8))();
    }
    *(ulong *)(iVar3._M_node + 9) = CONCAT44(extraout_var_01,iVar2);
  }
  return;
}

Assistant:

void
Header::insert (const char name[], const Attribute& attribute)
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);
    if (!strcmp (name, "dwaCompressionLevel") &&
        !strcmp (attribute.typeName (), "float"))
    {
        const TypedAttribute<float>& dwaattr =
            dynamic_cast<const TypedAttribute<float>&> (attribute);
        dwaCompressionLevel () = dwaattr.value ();
    }

    if (i == _map.end ())
    {
        Attribute* tmp = attribute.copy ();

        try
        {
            _map[name] = tmp;
        }
        catch (...)
        {
            delete tmp;
            throw;
        }
    }
    else
    {
        if (strcmp (i->second->typeName (), attribute.typeName ()))
            THROW (
                IEX_NAMESPACE::TypeExc,
                "Cannot assign a value of "
                "type \""
                    << attribute.typeName ()
                    << "\" "
                       "to image attribute \""
                    << name
                    << "\" of "
                       "type \""
                    << i->second->typeName () << "\".");

        Attribute* tmp = attribute.copy ();
        delete i->second;
        i->second = tmp;
    }
}